

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O2

void standard_about_amulet_method_proc(Am_Object param_1)

{
  bool bVar1;
  Am_Object about_win;
  Am_Object local_28;
  Am_String local_20;
  Am_Value dummy;
  
  Am_Get_About_Amulet_Window();
  bVar1 = Am_Object::Valid(&about_win);
  if (bVar1) {
    set_dialog_position(&about_win,-10000,-10000);
    dummy.type = 0;
    dummy.value.wrapper_value = (Am_Wrapper *)0x0;
    Am_Object::Am_Object(&local_28,&about_win);
    Am_Pop_Up_Window_And_Wait(&local_28,&dummy,true);
    Am_Object::~Am_Object(&local_28);
    Am_Value::~Am_Value(&dummy);
  }
  else {
    Am_String::Am_String(&local_20,"Can\'t find About Amulet Picture",true);
    Am_Show_Alert_Dialog(&local_20,-10000,-10000,true);
    Am_String::~Am_String(&local_20);
  }
  Am_Object::~Am_Object(&about_win);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, standard_about_amulet_method,
                 (Am_Object /* cmd */))
{
  Am_Object about_win = Am_Get_About_Amulet_Window();
  if (!about_win.Valid()) {
    Am_Show_Alert_Dialog("Can't find About Amulet Picture");
    return;
  }
  set_dialog_position(about_win, Am_AT_CENTER_SCREEN, Am_AT_CENTER_SCREEN);
  Am_Value dummy;
  Am_Pop_Up_Window_And_Wait(about_win, dummy, true);
}